

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_builder.hpp
# Opt level: O2

vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
* __thiscall
pico_tree::internal::
build_rkd_tree<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,784ul>
::operator()(vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
             *__return_storage_ptr__,void *this,
            space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
            space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule,size_t forest_size)

{
  space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
  space_00;
  size_t extraout_RDX;
  size_t dim;
  size_t extraout_RDX_00;
  bool bVar1;
  space_type s;
  kd_tree_data_type t;
  point<float,_784UL> r;
  size_t local_4a78;
  _Vector_base<float,_std::allocator<float>_> local_4a70;
  kd_tree_data_type local_4a58;
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> local_3190;
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul> local_c70 [3136];
  
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  space_00.space_ = (space_type *)stop_condition;
  std::
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  ::reserve(__return_storage_ptr__,forest_size);
  dim = extraout_RDX;
  while (bVar1 = forest_size != 0, forest_size = forest_size - 1, bVar1) {
    random_normal<float,784ul>((point<float,_784UL> *)local_c70,(internal *)0x310,dim);
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
    rotate_space<pico_tree::internal::space_wrapper<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>>>
              ((space_type *)&local_4a78,local_c70,(rotation_type *)space.space_,space_00);
    space_00.space_ = (space_type *)stop_condition;
    build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,784ul>
    ::operator()(&local_4a58,&local_3190,(space_type *)&local_4a78,stop_condition,start_bounds,rule)
    ;
    memcpy(&local_3190,local_c70,0xc40);
    local_3190.space.storage_.size = local_4a78;
    local_3190.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = local_4a70._M_impl.super__Vector_impl_data._M_start;
    local_3190.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = local_4a70._M_impl.super__Vector_impl_data._M_finish;
    local_3190.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4a70._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4a70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4a70._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4a70._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    memcpy(&local_3190.tree.root_box,&local_4a58.root_box,0x1880);
    local_3190.tree.allocator.resource_._vptr_list_pool_resource =
         (_func_int **)&PTR__list_pool_resource_00112d80;
    local_3190.tree.allocator.resource_.head_ = local_4a58.allocator.resource_.head_;
    local_4a58.allocator.resource_.head_ = (node *)0x0;
    local_3190.tree.allocator.object_index_ = local_4a58.allocator.object_index_;
    local_3190.tree.allocator.chunk_ = local_4a58.allocator.chunk_;
    local_3190.tree.root_node = local_4a58.root_node;
    ::std::
    vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>>
    ::
    emplace_back<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
              ((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>>
                *)__return_storage_ptr__,&local_3190);
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>::
    ~rkd_tree_hh_data(&local_3190);
    kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>::~kd_tree_data
              (&local_4a58);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_4a70);
    dim = extraout_RDX_00;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<rkd_tree_data_type> operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const& rule,
      size_t forest_size) {
    assert(forest_size > 0);

    using space_wrapper_type = typename rkd_tree_data_type::space_wrapper_type;
    using build_kd_tree_type = build_kd_tree<kd_tree_data_type, Dim_>;

    std::vector<rkd_tree_data_type> trees;
    trees.reserve(forest_size);
    for (std::size_t i = 0; i < forest_size; ++i) {
      auto r = rkd_tree_data_type::random_rotation(space);
      auto s = rkd_tree_data_type::rotate_space(r, space);
      auto t = build_kd_tree_type()(
          space_wrapper_type(s), stop_condition, start_bounds, rule);
      trees.push_back({std::move(r), std::move(s), std::move(t)});
    }
    return trees;
  }